

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

_Bool borg_play_step(wchar_t y2,wchar_t x2)

{
  loc grid2;
  chunk_conflict *pcVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  borg_grid *pbVar8;
  borg_kill *pbVar9;
  char *pcVar10;
  borg_take *pbVar11;
  loc_conflict lVar12;
  object *poVar13;
  loc lVar14;
  wchar_t yy;
  wchar_t xx;
  object *o_ptr;
  borg_take *take;
  borg_kill *kill;
  wchar_t door_found;
  wchar_t o_x;
  wchar_t o_y;
  wchar_t i;
  wchar_t oy;
  wchar_t ox;
  wchar_t y;
  wchar_t x;
  wchar_t dir;
  ui_event ch_evt;
  borg_grid *ag2;
  borg_grid *ag;
  wchar_t x2_local;
  wchar_t y2_local;
  
  door_found = L'\0';
  kill._4_4_ = L'\0';
  kill._0_4_ = 0;
  if (breeder_level) {
    for (i = L'\xffffffff'; i < L'\x02'; i = i + L'\x01') {
      for (o_y = L'\xffffffff'; o_y < L'\x02'; o_y = o_y + L'\x01') {
        if (((((o_y + borg.c.y != borg.c.y) || (i + borg.c.x != borg.c.x)) &&
             (borg_grids[o_y + borg.c.y][i + borg.c.x].feat == '\x03')) &&
            ((borg_grids[o_y + borg.c.y][i + borg.c.x].kill == '\0' && (track_door.num < 0xff)))) &&
           ((o_y + borg.c.y != y2 || (i + borg.c.x != x2)))) {
          door_found = o_y;
          kill._4_4_ = i;
          kill._0_4_ = (int)kill + 1;
        }
      }
    }
    if ((int)kill != 0) {
      wVar3 = borg_goto_dir(borg.c.y,borg.c.x,borg.c.y + door_found,borg.c.x + kill._4_4_);
      iVar4 = borg.c.x + ddx[wVar3];
      iVar5 = borg.c.y + ddy[wVar3];
      borg.goal.g.x = iVar4;
      borg.goal.g.y = iVar5;
      borg_note("# Closing a door");
      borg_keypress(99);
      borg_queue_direction(wVar3 + L'0');
      o_x = L'\0';
      while( true ) {
        if (track_door.num <= o_x) {
          if ((o_x == track_door.num) && (o_x < track_door.size)) {
            borg_note("# Noting the closing of a door.");
            track_door.num = track_door.num + 1;
            track_door.x[o_x] = iVar4;
            track_door.y[o_x] = iVar5;
          }
          return true;
        }
        if ((track_door.x[o_x] == iVar4) && (track_door.y[o_x] == iVar5)) break;
        o_x = o_x + L'\x01';
      }
      return true;
    }
  }
  if (((borg.goal.less) && (borg_grids[borg.c.y][borg.c.x].feat == '\x05')) &&
     (((player->opts).opt[0x20] & 1U) == 0)) {
    borg.goal.less = false;
    borg_keypress(0x3c);
    x2_local._3_1_ = true;
  }
  else {
    wVar3 = borg_goto_dir(borg.c.y,borg.c.x,y2,x2);
    if (wVar3 == L'\x05') {
      x2_local._3_1_ = false;
    }
    else {
      borg.goal.g.x = borg.c.x + ddx[wVar3];
      borg.goal.g.y = borg.c.y + ddy[wVar3];
      pbVar8 = borg_grids[borg.goal.g.y] + borg.goal.g.x;
      if (pbVar8->kill == '\0') {
        if ((pbVar8->take == '\0') || (borg_takes[pbVar8->take].kind == (object_kind *)0x0)) {
          if ((pbVar8->glyph & 1U) == 0) {
            if (((borg.trait[0x1a] == 0) || (borg.trait[0x70] != 0)) ||
               ((borg.trait[0x72] != 0 ||
                (((scaryguy_on_level & 1U) != 0 || ((pbVar8->trap & 1U) == 0)))))) {
              if (pbVar8->feat == '\x02') {
                uVar7 = Rand_div(100);
                if (uVar7 == 0) {
                  x2_local._3_1_ = false;
                }
                else {
                  for (o_x = L'\0'; o_x < L'\b'; o_x = o_x + L'\x01') {
                    if (((borg_grids[borg.c.y + ddy_ddd[o_x]][borg.c.x + ddx_ddd[o_x]].kill != '\0')
                        && (borg.trait[0x23] < 0xf)) && (borg.trait[0x71] == 0)) {
                      return false;
                    }
                  }
                  uVar7 = Rand_div(100);
                  if ((uVar7 == 0) || (499 < borg.time_this_panel)) {
                    _Var2 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS);
                    if ((_Var2) || (_Var2 = borg_activate_item(act_destroy_doors), _Var2)) {
                      borg_note("# Disable Traps, Destroy Doors");
                      return true;
                    }
                    _Var2 = borg_spell(TURN_STONE_TO_MUD);
                    if ((((_Var2) || (_Var2 = borg_spell(SHATTER_STONE), _Var2)) ||
                        (_Var2 = borg_activate_ring(sv_ring_digging), _Var2)) ||
                       (_Var2 = borg_activate_item(act_stone_to_mud), _Var2)) {
                      borg_note("# Melting a door");
                      borg_keypress(wVar3 + L'0');
                      if (track_closed.num != 0) {
                        track_closed.num = 0;
                      }
                      return true;
                    }
                  }
                  if ((my_need_alter & 1U) == 0) {
                    borg_note("# Opening a door");
                    borg_keypress(0x6f);
                  }
                  else {
                    borg_keypress(0x2b);
                    my_need_alter = false;
                  }
                  borg_queue_direction(wVar3 + L'0');
                  if (track_closed.num != 0) {
                    track_closed.num = 0;
                  }
                  x2_local._3_1_ = true;
                }
              }
              else if (pbVar8->feat == '\x16') {
                x2_local._3_1_ = false;
              }
              else if ((pbVar8->feat == '\x17') && (borg.trait[0x40] == 0)) {
                x2_local._3_1_ = false;
              }
              else if ((pbVar8->feat < 0xf) || (0x15 < pbVar8->feat)) {
                _Var2 = feat_is_shop((uint)pbVar8->feat);
                if (_Var2) {
                  pcVar10 = format("# Entering a \'%d\' shop",(ulong)pbVar8->store);
                  borg_note(pcVar10);
                  borg_keypress(wVar3 + L'0');
                  x2_local._3_1_ = true;
                }
                else {
                  if ((my_need_alter & 1U) != 0) {
                    borg_keypress(0x2b);
                    my_need_alter = false;
                  }
                  borg_keypress(wVar3 + L'0');
                  borg.in_shop = false;
                  x2_local._3_1_ = true;
                }
              }
              else if ((pbVar8->feat == '\x10') || (borg.goal.type != 4)) {
                _Var2 = borg_can_dig(false,pbVar8->feat);
                if (_Var2) {
                  _Var2 = borg_spell(TURN_STONE_TO_MUD);
                  if ((((_Var2) || (_Var2 = borg_spell(SHATTER_STONE), _Var2)) ||
                      (_Var2 = borg_activate_ring(sv_ring_digging), _Var2)) ||
                     (_Var2 = borg_activate_item(act_stone_to_mud), _Var2)) {
                    borg_note("# Melting a wall/etc");
                    borg_keypress(wVar3 + L'0');
                    track_vein.num = 0;
                    x2_local._3_1_ = true;
                  }
                  else {
                    uVar7 = Rand_div(500);
                    if (((int)uVar7 < 6) && ((vault_on_level & 1U) == 0)) {
                      x2_local._3_1_ = false;
                    }
                    else {
                      borg_note("# Digging through wall/etc");
                      borg_keypress(0x54);
                      borg_keypress(wVar3 + L'0');
                      track_vein.num = 0;
                      x2_local._3_1_ = true;
                    }
                  }
                }
                else {
                  borg.goal.type = 0;
                  x2_local._3_1_ = false;
                }
              }
              else {
                x2_local._3_1_ = false;
              }
            }
            else {
              _Var2 = borg_activate_item(act_disable_traps);
              if (_Var2) {
                borg_note("# Activation to Disable Traps, Destroy Doors");
                pbVar8->trap = false;
                borg.no_rest_prep = 3000;
                lVar14.y = borg.goal.g.y;
                lVar14.x = borg.goal.g.x;
                borg_target(lVar14);
                x2_local._3_1_ = true;
              }
              else if (((borg.trait[0x1f] << 2) / 5 < borg.trait[0x1e]) &&
                      (_Var2 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS), _Var2)) {
                borg_note("# Disable Traps, Destroy Doors");
                pbVar8->trap = false;
                borg.no_rest_prep = 3000;
                x2_local._3_1_ = true;
              }
              else {
                borg_note("# Disarming a trap");
                borg_keypress(0x44);
                borg_queue_direction(wVar3 + L'0');
                pbVar8->trap = false;
                x2_local._3_1_ = true;
              }
            }
          }
          else {
            pcVar10 = format("# Walking onto a glyph of warding.");
            borg_note(pcVar10);
            borg_keypress(wVar3 + L'0');
            x2_local._3_1_ = true;
          }
        }
        else {
          pbVar11 = borg_takes + pbVar8->take;
          pcVar10 = strstr(pbVar11->kind->name,"chest");
          if ((pcVar10 != (char *)0x0) &&
             (pcVar10 = strstr(pbVar11->kind->name,"Ruined"), pcVar1 = cave, pcVar10 == (char *)0x0)
             ) {
            lVar12 = (loc_conflict)loc(x2,y2);
            poVar13 = borg_get_top_object((chunk *)pcVar1,lVar12);
            if (poVar13 == (object *)0x0) {
              borg_delete_take((uint)pbVar8->take);
              return false;
            }
            if (((1 < poVar13->pval) && (poVar13->known != (object *)0x0)) &&
               (borg_cfg[0x16] <= borg.trait[0x38] - (int)poVar13->pval)) {
              pcVar10 = format("# Disarming a \'%s\' at (%d,%d)",pbVar11->kind->name,
                               (ulong)pbVar11->y,(ulong)pbVar11->x);
              borg_note(pcVar10);
              borg_keypress(0x44);
              borg_queue_direction(wVar3 + L'0');
              return true;
            }
            if ((poVar13->pval < 0) || (poVar13->known == (object *)0x0)) {
              pcVar10 = format("# Opening a \'%s\' at (%d,%d)",pbVar11->kind->name,(ulong)pbVar11->y
                               ,(ulong)pbVar11->x);
              borg_note(pcVar10);
              borg_keypress(0x6f);
              borg_queue_direction(wVar3 + L'0');
              return true;
            }
          }
          if ((((pbVar11->orbed & 1U) == 0) && (L'\x01' < pbVar11->tval)) &&
             (pbVar11->tval < L'\x16')) {
            lVar14 = loc((uint)pbVar11->x,(uint)pbVar11->y);
            grid2.y = borg.c.y;
            grid2.x = borg.c.x;
            wVar6 = distance(lVar14,grid2);
            if ((wVar6 == L'\x01') && (_Var2 = borg_spell_okay_fail(ORB_OF_DRAINING,0x19), _Var2)) {
              lVar14 = loc((uint)pbVar11->x,(uint)pbVar11->y);
              borg_target(lVar14);
              borg_spell(ORB_OF_DRAINING);
              borg_note("# Orbing an object to check for cursed item.");
              borg_keypress(0x35);
              pbVar11->orbed = true;
              for (o_x = L'\0'; pcVar1 = cave, o_x < L'\x18'; o_x = o_x + L'\x01') {
                iVar4 = (uint)pbVar11->x + (int)borg_ddx_ddd[o_x];
                iVar5 = (uint)pbVar11->y + (int)borg_ddy_ddd[o_x];
                lVar12 = (loc_conflict)loc(iVar4,iVar5);
                _Var2 = square_in_bounds_fully((chunk *)pcVar1,lVar12);
                if ((_Var2) && (borg_grids[iVar5][iVar4].take != '\0')) {
                  borg_takes[borg_grids[iVar5][iVar4].take].orbed = true;
                }
              }
              return true;
            }
          }
          pcVar10 = format("# Walking onto and deleting a \'%s\' at (%d,%d)",pbVar11->kind->name,
                           (ulong)pbVar11->y,(ulong)pbVar11->x);
          borg_note(pcVar10);
          borg_delete_take((uint)pbVar8->take);
          borg_keypress(wVar3 + L'0');
          x2_local._3_1_ = true;
        }
      }
      else {
        pbVar9 = borg_kills + pbVar8->kill;
        if ((pbVar9->r_idx == 0) || ((int)(z_info->r_max - 1) <= (int)(uint)pbVar9->r_idx)) {
          x2_local._3_1_ = false;
        }
        else if ((borg.trait[0x71] == 0) && (borg.trait[0xba] == 0)) {
          _Var2 = flag_has_dbg(r_info[pbVar9->r_idx].flags,0xb,1,"r_info[kill->r_idx].flags",
                               "RF_UNIQUE");
          if (((_Var2) && (borg.trait[0x69] == 0)) && (borg.trait[0x23] < 5)) {
            x2_local._3_1_ = false;
          }
          else {
            pcVar10 = borg_race_name((uint)pbVar9->r_idx);
            pcVar10 = format("# Walking into a \'%s\' at (%d,%d)",pcVar10,
                             (ulong)(uint)(pbVar9->pos).y,(ulong)(uint)(pbVar9->pos).x);
            borg_note(pcVar10);
            if ((my_no_alter & 1U) == 0) {
              borg_keypress(0x2b);
            }
            else {
              borg_keypress(0x3b);
              my_no_alter = false;
            }
            borg_keypress(wVar3 + L'0');
            x2_local._3_1_ = true;
          }
        }
        else {
          x2_local._3_1_ = false;
        }
      }
    }
  }
  return x2_local._3_1_;
}

Assistant:

static bool borg_play_step(int y2, int x2)
{
    borg_grid *ag;
    borg_grid *ag2;
    ui_event   ch_evt = EVENT_EMPTY;
    int        dir, x, y, ox, oy, i;

    int o_y = 0, o_x = 0, door_found = 0;

    /* Breeder levels, close all doors */
    if (breeder_level) {
        /* scan the adjacent grids */
        for (ox = -1; ox <= 1; ox++) {
            for (oy = -1; oy <= 1; oy++) {
                /* skip our own spot */
                if ((oy + borg.c.y == borg.c.y) && (ox + borg.c.x == borg.c.x))
                    continue;

                /* Acquire location */
                ag = &borg_grids[oy + borg.c.y][ox + borg.c.x];

                /* skip non open doors */
                if (ag->feat != FEAT_OPEN)
                    continue;

                /* skip monster on door */
                if (ag->kill)
                    continue;

                /* Skip repeatedly closed doors */
                if (track_door.num >= 255)
                    continue;

                /* skip our original goal */
                if ((oy + borg.c.y == y2) && (ox + borg.c.x == x2))
                    continue;

                /* save this spot */
                o_y = oy;
                o_x = ox;
                door_found++;
            }
        }

        /* Is there a door to close? */
        if (door_found) {
            /* Get a direction, if possible */
            dir = borg_goto_dir(
                borg.c.y, borg.c.x, borg.c.y + o_y, borg.c.x + o_x);

            /* Obtain the destination */
            x = borg.c.x + ddx[dir];
            y = borg.c.y + ddy[dir];

            /* Hack -- set goal */
            borg.goal.g.x = x;
            borg.goal.g.y = y;

            /* Close */
            borg_note("# Closing a door");
            borg_keypress('c');
            borg_queue_direction(I2D(dir));

            /* Check for an existing flag */
            for (i = 0; i < track_door.num; i++) {
                /* Stop if we already new about this door */
                if ((track_door.x[i] == x) && (track_door.y[i] == y))
                    return true;
            }

            /* Track the newly closed door */
            if (i == track_door.num && i < track_door.size) {

                borg_note("# Noting the closing of a door.");
                track_door.num++;
                track_door.x[i] = x;
                track_door.y[i] = y;
            }
            return true;
        }
    }

    /* Stand stairs up */
    if (borg.goal.less) {

        /* Define the grid we are looking at to be our own grid */
        ag = &borg_grids[borg.c.y][borg.c.x];

        /* Up stairs. Cheat the game grid info in.
         * (cave_feat[borg.c.y][borg.c.x] == FEAT_LESS) */
        if (ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {

            borg.goal.less   = false;
            borg_keypress('<');

            /* Success */
            return true;
        }
    }

    /* Get a direction, if possible */
    dir = borg_goto_dir(borg.c.y, borg.c.x, y2, x2);

    /* We have arrived */
    if (dir == 5)
        return false;

    /* Obtain the destination */
    x = borg.c.x + ddx[dir];
    y = borg.c.y + ddy[dir];

    /* Access the grid we are stepping on */
    ag = &borg_grids[y][x];

    /* Hack -- set goal */
    borg.goal.g.x = x;
    borg.goal.g.y = y;

    /* Monsters -- Attack */
    if (ag->kill) {
        borg_kill *kill = &borg_kills[ag->kill];

        /* dead monsters or "player ghosts" */
        if (kill->r_idx == 0 || kill->r_idx >= z_info->r_max - 1)
            return false;

        /* can't attack someone if afraid! */
        if (borg.trait[BI_ISAFRAID] || borg.trait[BI_CRSFEAR])
            return false;

        /* Hack -- ignore Maggot until later.  */
        if ((rf_has(r_info[kill->r_idx].flags, RF_UNIQUE))
            && borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 5)
            return false;

        /* Message */
        borg_note(format("# Walking into a '%s' at (%d,%d)",
            borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));

        /* Walk into it */
        if (my_no_alter) {
            borg_keypress(';');
            my_no_alter = false;
        } else {
            borg_keypress('+');
        }
        borg_keypress(I2D(dir));
        return true;
    }

    /* Objects -- Take */
    if (ag->take && borg_takes[ag->take].kind) {
        borg_take *take = &borg_takes[ag->take];

        /*** Handle Chests ***/
        /* The borg will cheat when it comes to chests.
         * He does not have to but it makes him faster and
         * it does not give him any information that a
         * person would not know by looking at the trap.
         * So there is no advantage to the borg.
         */

        if (strstr(take->kind->name, "chest")
            && !strstr(take->kind->name, "Ruined")) {
            struct object *o_ptr = borg_get_top_object(cave, loc(x2, y2));

            /* this should only happen when something picks up the chest */
            /* outside the borgs view.  */
            if (!o_ptr) {
                borg_delete_take(ag->take);
                return false;
            }

            /* Traps. Disarm it w/ fail check */
            if (o_ptr->pval > 1 && o_ptr->known
                && borg.trait[BI_DEV] - o_ptr->pval
                       >= borg_cfg[BORG_CHEST_FAIL_TOLERANCE]) {
                borg_note(format("# Disarming a '%s' at (%d,%d)",
                    take->kind->name, take->y, take->x));

                /* Open it */
                borg_keypress('D');
                borg_queue_direction(I2D(dir));
                return true;
            }

            /* No trap, or unknown trap that passed above checks - Open it */
            if (o_ptr->pval < 0 || !o_ptr->known) {
                borg_note(format("# Opening a '%s' at (%d,%d)",
                    take->kind->name, take->y, take->x));

                /* Open it */
                borg_keypress('o');
                borg_queue_direction(I2D(dir));
                return true;
            }

            /* Empty chest */
            /* continue in routine and pick it up */
        }

        /*** Handle Orb of Draining ***/

        /* Priest/Paladin borgs who have very limited ID ability can save some
         * money and inventory space my casting Orb of Draining on objects.
         * Cursed objects will melt under the Orb of Draining spell.  This will
         * save the borg from carrying the item around until he can ID it.
         *
         * By default, the flag ORBED is set to false when an item is created.
         * If the borg gets close to an item, and the conditions are favorable,
         * he will cast OoD on the item and change the flag.
         */
        if (take->orbed == false
            && (take->tval >= TV_SHOT && take->tval < TV_STAFF)) {
            if (distance(loc(take->x, take->y), borg.c) == 1) {
                if (borg_spell_okay_fail(ORB_OF_DRAINING, 25)) {
                    /* Target the Take location */
                    borg_target(loc(take->x, take->y));

                    /* Cast the prayer */
                    borg_spell(ORB_OF_DRAINING);

                    /* Message */
                    borg_note("# Orbing an object to check for cursed item.");

                    /* use the old target */
                    borg_keypress('5');

                    /* Change the take flag */
                    take->orbed = true;

                    /* check the blast radius of the prayer for other items */
                    for (i = 0; i < 24; i++) {
                        /* Extract the location */
                        int xx = take->x + borg_ddx_ddd[i];
                        int yy = take->y + borg_ddy_ddd[i];

                        /* Check the grid for a take */
                        if (!square_in_bounds_fully(cave, loc(xx, yy)))
                            continue;
                        ag2 = &borg_grids[yy][xx];
                        if (ag2->take) {
                            /* This item was orbed (mostly true)*/
                            borg_takes[borg_grids[yy][xx].take].orbed = true;
                        }
                    }

                    /* Return */
                    return true;
                }
            }
        }

        /*** Handle other takes ***/
        /* Message */
        borg_note(format("# Walking onto and deleting a '%s' at (%d,%d)",
            take->kind->name, take->y, take->x));

        /* Delete the item from the list */
        borg_delete_take(ag->take);

        /* Walk onto it */
        borg_keypress(I2D(dir));

        return true;
    }

    /* Glyph of Warding */
    if (ag->glyph) {
        /* Message */
        borg_note(format("# Walking onto a glyph of warding."));

        /* Walk onto it */
        borg_keypress(I2D(dir));
        return true;
    }

    /* Traps -- disarm -- */
    /* NOTE: If a scary guy is on the level, we allow the borg to run over */
    /* the trap in order to escape this level. */
    if (borg.trait[BI_LIGHT] && !borg.trait[BI_ISBLIND]
        && !borg.trait[BI_ISCONFUSED] && !scaryguy_on_level && ag->trap) {

        /* allow "destroy doors" activation */
        if (borg_activate_item(act_disable_traps)) {
            borg_note("# Activation to Disable Traps, Destroy Doors");
            ag->trap = 0;
            /* since this just disables the trap and doesn't remove it, */
            /* don't rest next to it */
            borg.no_rest_prep = 3000;

            /* the activation needs to target the trap */
            borg_target(borg.goal.g);
            return true;
        }

        /* allow "destroy doors" spell */
        /* don't bother unless we are near full mana */
        if (borg.trait[BI_CURSP] > ((borg.trait[BI_MAXSP] * 4) / 5)) {
            if (borg_spell(DISABLE_TRAPS_DESTROY_DOORS)) {
                borg_note("# Disable Traps, Destroy Doors");
                ag->trap = 0;
                /* since this just disables the trap and doesn't remove it, */
                /* don't rest next to it */
                borg.no_rest_prep = 3000;
                return true;
            }
        }

        /* Disarm */
        borg_note("# Disarming a trap");
        borg_keypress('D');
        borg_queue_direction(I2D(dir));

        /* We are not sure if the trap will get 'untrapped'. pretend it will*/
        ag->trap = 0;
        return true;
    }

    /* Closed Doors -- Open */
    if (ag->feat == FEAT_CLOSED) {
        /* Paranoia XXX XXX XXX */
        if (!randint0(100))
            return false;

        /* Not a good idea to open locked doors if a monster
         * is next to the borg beating on him
         */

        /* scan the adjacent grids */
        for (i = 0; i < 8; i++) {
            /* Grid in that direction */
            x = borg.c.x + ddx_ddd[i];
            y = borg.c.y + ddy_ddd[i];

            /* Access the grid */
            ag2 = &borg_grids[y][x];

            /* If monster adjacent to me and I'm weak, don't
             * even try to open the door
             */
            if (ag2->kill && borg.trait[BI_CLEVEL] < 15
                && !borg.trait[BI_ISAFRAID])
                return false;
        }

        /* Use other techniques from time to time */
        if (!randint0(100) || borg.time_this_panel >= 500) {
            /* Mega-Hack -- allow "destroy doors" */
            if (borg_spell(DISABLE_TRAPS_DESTROY_DOORS)
                || borg_activate_item(act_destroy_doors)) {
                borg_note("# Disable Traps, Destroy Doors");
                return true;
            }

            /* Mega-Hack -- allow "stone to mud" */
            if (borg_spell(TURN_STONE_TO_MUD) || borg_spell(SHATTER_STONE)
                || borg_activate_ring(sv_ring_digging)
                || borg_activate_item(act_stone_to_mud)) {
                borg_note("# Melting a door");
                borg_keypress(I2D(dir));

                /* Remove this closed door from the list.
                 * Its faster to clear all doors from the list
                 * then rebuild the list.
                 */
                if (track_closed.num) {
                    track_closed.num = 0;
                }
                return true;
            }
        }

        /* Open */
        if (my_need_alter) {
            borg_keypress('+');
            my_need_alter = false;
        } else {
            borg_note("# Opening a door");
            borg_keypress('o');
        }
        borg_queue_direction(I2D(dir));

        /* Remove this closed door from the list.
         * Its faster to clear all doors from the list
         * then rebuild the list.
         */
        if (track_closed.num) {
            track_closed.num = 0;
        }

        return true;
    }

    /* eliminate things we can't step on */
    /* we only seem to get this far when trying to dig out vaults */
    if (ag->feat == FEAT_PERM)
        return false;

    if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Rubble, Treasure, Seams, Walls -- Tunnel or Melt */
    /* HACK depends on FEAT order, kinda evil. */
    if (ag->feat >= FEAT_SECRET && ag->feat <= FEAT_GRANITE) {
        /* Don't dig walls and seams when exploring (do dig rubble) */
        if (ag->feat != FEAT_RUBBLE && borg.goal.type == GOAL_DARK)
            return false;

        /* Don't bother digging without sufficient dig ability */
        if (!borg_can_dig(false, ag->feat)) {
            borg.goal.type = 0;
            return false;
        }

        /* Use Stone to Mud when available */
        if (borg_spell(TURN_STONE_TO_MUD) || borg_spell(SHATTER_STONE)
            || borg_activate_ring(sv_ring_digging)
            || borg_activate_item(act_stone_to_mud)) {
            borg_note("# Melting a wall/etc");
            borg_keypress(I2D(dir));

            /* Forget number of mineral veins to force rebuild of vein list */
            track_vein.num = 0;

            return true;
        }

        /* Mega-Hack -- prevent infinite loops */
        if (randint0(500) <= 5 && !vault_on_level)
            return false;

        /* Switch to a digger if we have one is automatic */

        /* Dig */
        borg_note("# Digging through wall/etc");
        borg_keypress('T');
        borg_keypress(I2D(dir));

        /* Forget number of mineral veins to force rebuild of vein list */
        /* XXX Maybe only do this if successful? */
        track_vein.num = 0;

        return true;
    }

    /* Shops -- Enter */
    if (feat_is_shop(ag->feat)) {
        /* Message */
        borg_note(format("# Entering a '%d' shop", ag->store));

        /* Enter the shop */
        borg_keypress(I2D(dir));
        return true;
    }

    /* Walk in that direction */
    if (my_need_alter) {
        borg_keypress('+');
        my_need_alter = false;
    } else {
        /* nothing */
    }

    /* Actually enter the direction */
    borg_keypress(I2D(dir));

    /* I'm not in a store */
    borg.in_shop = false;

    /* for some reason, selling and buying in the store sets the event handler
     * to Select. This is a game bug not a borg bug.  The borg is trying to
     * overcome the game bug. But he still has some troubles unhooking in town
     * after shopping.  Again, this is due to the event handler.  The handler
     * should release the EVT_SELECT but it does not.
     */

    if (ch_evt.type & EVT_SELECT)
        ch_evt.type = EVT_KBRD;
    if (ch_evt.type & EVT_MOVE)
        ch_evt.type = EVT_KBRD;

    /* Did something */
    return true;
}